

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  long lVar4;
  undefined8 *puVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  bool bVar19;
  ulong uVar20;
  undefined8 uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  byte bVar28;
  uint uVar29;
  undefined1 (*pauVar30) [32];
  long lVar31;
  byte bVar32;
  byte bVar33;
  uint uVar34;
  Scene *pSVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [32];
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined4 uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_25f5;
  uint local_25f4;
  ulong local_25f0;
  Scene *local_25e8;
  ulong local_25e0;
  int local_25d4;
  RayHit *local_25d0;
  RayQueryContext *local_25c8;
  RTCIntersectArguments *local_25c0;
  Geometry *local_25b8;
  ulong *local_25b0;
  long local_25a8;
  long local_25a0;
  RTCFilterFunctionNArguments local_2598;
  float local_2568;
  undefined4 local_2564;
  undefined4 local_2560;
  undefined4 local_255c;
  undefined4 local_2558;
  undefined4 local_2554;
  uint local_2550;
  uint local_254c;
  uint local_2548;
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined1 local_2508 [32];
  undefined1 local_24e8 [32];
  undefined1 local_24c8 [32];
  undefined1 local_24a8 [32];
  undefined1 local_2488 [32];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  undefined1 local_2448 [16];
  undefined1 *local_2438;
  byte local_2430;
  undefined1 local_2428 [16];
  undefined1 local_2418 [16];
  undefined1 local_2408 [16];
  undefined1 local_23f8 [16];
  undefined1 local_23e8 [16];
  float local_23d8 [4];
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  float fVar2;
  float fVar3;
  undefined1 auVar68 [32];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25b0 = local_2368;
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_2370[0] = 0;
    auVar61 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar62 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar41._8_4_ = 0x7fffffff;
    auVar41._0_8_ = 0x7fffffff7fffffff;
    auVar41._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx512vl((undefined1  [16])aVar6,auVar41);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
    auVar95 = ZEXT1664(auVar42);
    uVar20 = vcmpps_avx512vl(auVar41,auVar42,1);
    bVar19 = (bool)((byte)uVar20 & 1);
    auVar60._0_4_ = (uint)bVar19 * auVar42._0_4_ | (uint)!bVar19 * (int)aVar6.x;
    bVar19 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar60._4_4_ = (uint)bVar19 * auVar42._4_4_ | (uint)!bVar19 * (int)aVar6.y;
    bVar19 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar60._8_4_ = (uint)bVar19 * auVar42._8_4_ | (uint)!bVar19 * (int)aVar6.z;
    bVar19 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar60._12_4_ = (uint)bVar19 * auVar42._12_4_ | (uint)!bVar19 * aVar6.field_3.a;
    auVar41 = vrcp14ps_avx512vl(auVar60);
    auVar42._8_4_ = 0x3f800000;
    auVar42._0_8_ = 0x3f8000003f800000;
    auVar42._12_4_ = 0x3f800000;
    auVar42 = vfnmadd213ps_avx512vl(auVar60,auVar41,auVar42);
    auVar60 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
    local_2488 = vbroadcastss_avx512vl(auVar60);
    auVar96 = ZEXT3264(local_2488);
    auVar41 = vmovshdup_avx(auVar60);
    local_24a8 = vbroadcastsd_avx512vl(auVar41);
    auVar97 = ZEXT3264(local_24a8);
    auVar70._8_4_ = 2;
    auVar70._0_8_ = 0x200000002;
    auVar70._12_4_ = 2;
    auVar70._16_4_ = 2;
    auVar70._20_4_ = 2;
    auVar70._24_4_ = 2;
    auVar70._28_4_ = 2;
    auVar42 = vshufpd_avx(auVar60,auVar60,1);
    local_24c8 = vpermps_avx512vl(auVar70,ZEXT1632(auVar60));
    auVar98 = ZEXT3264(local_24c8);
    fVar75 = auVar60._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar64._8_4_ = 1;
    auVar64._0_8_ = 0x100000001;
    auVar64._12_4_ = 1;
    auVar64._16_4_ = 1;
    auVar64._20_4_ = 1;
    auVar64._24_4_ = 1;
    auVar64._28_4_ = 1;
    auVar67._4_4_ = fVar75;
    auVar67._0_4_ = fVar75;
    auVar67._8_4_ = fVar75;
    auVar67._12_4_ = fVar75;
    auVar67._16_4_ = fVar75;
    auVar67._20_4_ = fVar75;
    auVar67._24_4_ = fVar75;
    auVar67._28_4_ = fVar75;
    auVar65 = ZEXT1632(CONCAT412(auVar60._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar60._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar60._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar75))
                                ));
    auVar64 = vpermps_avx2(auVar64,auVar65);
    auVar65 = vpermps_avx2(auVar70,auVar65);
    uVar36 = (ulong)(auVar60._0_4_ < 0.0) << 3;
    uVar20 = (ulong)(auVar41._0_4_ < 0.0) * 8 + 0x10;
    lVar4 = (ulong)(auVar42._0_4_ < 0.0) * 8;
    uVar81 = auVar62._0_4_;
    auVar78 = ZEXT3264(CONCAT428(uVar81,CONCAT424(uVar81,CONCAT420(uVar81,CONCAT416(uVar81,CONCAT412
                                                  (uVar81,CONCAT48(uVar81,CONCAT44(uVar81,uVar81))))
                                                  ))));
    uVar39 = uVar36 ^ 8;
    auVar66._8_4_ = 0x80000000;
    auVar66._0_8_ = 0x8000000080000000;
    auVar66._12_4_ = 0x80000000;
    auVar66._16_4_ = 0x80000000;
    auVar66._20_4_ = 0x80000000;
    auVar66._24_4_ = 0x80000000;
    auVar66._28_4_ = 0x80000000;
    local_24e8 = vxorps_avx512vl(auVar67,auVar66);
    auVar99 = ZEXT3264(local_24e8);
    local_2508 = vxorps_avx512vl(auVar64,auVar66);
    auVar100 = ZEXT3264(local_2508);
    local_2398._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
    local_2398._8_4_ = auVar65._8_4_ ^ 0x80000000;
    local_2398._12_4_ = auVar65._12_4_ ^ 0x80000000;
    local_2398._16_4_ = auVar65._16_4_ ^ 0x80000000;
    local_2398._20_4_ = auVar65._20_4_ ^ 0x80000000;
    local_2398._24_4_ = auVar65._24_4_ ^ 0x80000000;
    local_2398._28_4_ = auVar65._28_4_ ^ 0x80000000;
    auVar90 = ZEXT3264(local_2398);
    uVar81 = auVar61._0_4_;
    local_23b8._4_4_ = uVar81;
    local_23b8._0_4_ = uVar81;
    local_23b8._8_4_ = uVar81;
    local_23b8._12_4_ = uVar81;
    local_23b8._16_4_ = uVar81;
    local_23b8._20_4_ = uVar81;
    local_23b8._24_4_ = uVar81;
    local_23b8._28_4_ = uVar81;
    auVar92 = ZEXT3264(local_23b8);
    auVar93 = ZEXT3264(_DAT_01fe9900);
    auVar94 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    local_25c8 = context;
    local_25d0 = ray;
    local_25f0 = uVar36;
    do {
      pfVar15 = (float *)(local_25b0 + -1);
      local_25b0 = local_25b0 + -2;
      if (*pfVar15 <= (ray->super_RayK<1>).tfar) {
        uVar38 = *local_25b0;
        while ((uVar38 & 8) == 0) {
          pauVar37 = (undefined1 (*) [32])(uVar38 & 0xfffffffffffffff0);
          pauVar30 = pauVar37 + 2;
          if (pauVar37 == (undefined1 (*) [32])0x0) {
            pauVar30 = (undefined1 (*) [32])0x0;
          }
          auVar79._8_8_ = 0;
          auVar79._0_8_ = *(ulong *)*pauVar30;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = *(ulong *)(*pauVar30 + 8);
          uVar38 = vpcmpub_avx512vl(auVar79,auVar82,2);
          uVar81 = *(undefined4 *)(pauVar30[1] + 0x10);
          auVar65._4_4_ = uVar81;
          auVar65._0_4_ = uVar81;
          auVar65._8_4_ = uVar81;
          auVar65._12_4_ = uVar81;
          auVar65._16_4_ = uVar81;
          auVar65._20_4_ = uVar81;
          auVar65._24_4_ = uVar81;
          auVar65._28_4_ = uVar81;
          uVar81 = *(undefined4 *)(pauVar30[1] + 0x1c);
          auVar83._4_4_ = uVar81;
          auVar83._0_4_ = uVar81;
          auVar83._8_4_ = uVar81;
          auVar83._12_4_ = uVar81;
          auVar83._16_4_ = uVar81;
          auVar83._20_4_ = uVar81;
          auVar83._24_4_ = uVar81;
          auVar83._28_4_ = uVar81;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(*pauVar30 + uVar36);
          auVar64 = vpmovzxbd_avx2(auVar8);
          auVar64 = vcvtdq2ps_avx(auVar64);
          auVar61 = vfmadd213ps_fma(auVar64,auVar83,auVar65);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(*pauVar30 + uVar39);
          auVar64 = vpmovzxbd_avx2(auVar9);
          auVar64 = vcvtdq2ps_avx(auVar64);
          auVar62 = vfmadd213ps_fma(auVar64,auVar83,auVar65);
          uVar81 = *(undefined4 *)(pauVar30[1] + 0x14);
          auVar68._4_4_ = uVar81;
          auVar68._0_4_ = uVar81;
          auVar68._8_4_ = uVar81;
          auVar68._12_4_ = uVar81;
          auVar68._16_4_ = uVar81;
          auVar68._20_4_ = uVar81;
          auVar68._24_4_ = uVar81;
          auVar68._28_4_ = uVar81;
          uVar81 = *(undefined4 *)pauVar30[2];
          auVar72._4_4_ = uVar81;
          auVar72._0_4_ = uVar81;
          auVar72._8_4_ = uVar81;
          auVar72._12_4_ = uVar81;
          auVar72._16_4_ = uVar81;
          auVar72._20_4_ = uVar81;
          auVar72._24_4_ = uVar81;
          auVar72._28_4_ = uVar81;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(*pauVar30 + uVar20);
          auVar64 = vpmovzxbd_avx2(auVar10);
          auVar64 = vcvtdq2ps_avx(auVar64);
          auVar41 = vfmadd213ps_fma(auVar64,auVar72,auVar68);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(*pauVar30 + (uVar20 ^ 8));
          auVar64 = vpmovzxbd_avx2(auVar11);
          auVar64 = vcvtdq2ps_avx(auVar64);
          auVar42 = vfmadd213ps_fma(auVar64,auVar72,auVar68);
          uVar81 = *(undefined4 *)(pauVar30[1] + 0x18);
          auVar73._4_4_ = uVar81;
          auVar73._0_4_ = uVar81;
          auVar73._8_4_ = uVar81;
          auVar73._12_4_ = uVar81;
          auVar73._16_4_ = uVar81;
          auVar73._20_4_ = uVar81;
          auVar73._24_4_ = uVar81;
          auVar73._28_4_ = uVar81;
          uVar81 = *(undefined4 *)(pauVar30[2] + 4);
          auVar71._4_4_ = uVar81;
          auVar71._0_4_ = uVar81;
          auVar71._8_4_ = uVar81;
          auVar71._12_4_ = uVar81;
          auVar71._16_4_ = uVar81;
          auVar71._20_4_ = uVar81;
          auVar71._24_4_ = uVar81;
          auVar71._28_4_ = uVar81;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(pauVar30[1] + lVar4);
          auVar64 = vpmovzxbd_avx2(auVar12);
          auVar64 = vcvtdq2ps_avx(auVar64);
          auVar60 = vfmadd213ps_fma(auVar64,auVar71,auVar73);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)(*pauVar30 + (lVar4 + 0x20U ^ 8));
          auVar64 = vpmovzxbd_avx2(auVar13);
          auVar64 = vcvtdq2ps_avx(auVar64);
          auVar59 = vfmadd213ps_fma(auVar64,auVar71,auVar73);
          auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar61),auVar96._0_32_,auVar99._0_32_);
          auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar97._0_32_,auVar100._0_32_);
          auVar64 = vpmaxsd_avx2(auVar64,auVar65);
          auVar70 = auVar90._0_32_;
          auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar60),auVar98._0_32_,auVar70);
          auVar65 = vpmaxsd_avx2(auVar65,auVar92._0_32_);
          auVar64 = vpmaxsd_avx2(auVar64,auVar65);
          auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar62),auVar96._0_32_,auVar99._0_32_);
          auVar66 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar97._0_32_,auVar100._0_32_);
          auVar65 = vpminsd_avx2(auVar65,auVar66);
          auVar66 = vfmadd213ps_avx512vl(ZEXT1632(auVar59),auVar98._0_32_,auVar70);
          auVar66 = vpminsd_avx2(auVar66,auVar78._0_32_);
          auVar65 = vpminsd_avx2(auVar65,auVar66);
          uVar40 = vpcmpd_avx512vl(auVar64,auVar65,2);
          uVar40 = uVar38 & 0xff & uVar40;
          bVar28 = (byte)uVar40;
          if (bVar28 == 0) goto LAB_01f2ce4e;
          auVar65 = *pauVar37;
          auVar66 = pauVar37[1];
          auVar67 = vpternlogd_avx512vl(auVar93._0_32_,auVar64,auVar94._0_32_,0xf8);
          auVar68 = vpcompressd_avx512vl(auVar67);
          auVar69._0_4_ =
               (uint)(bVar28 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar67._0_4_;
          bVar19 = (bool)((byte)(uVar40 >> 1) & 1);
          auVar69._4_4_ = (uint)bVar19 * auVar68._4_4_ | (uint)!bVar19 * auVar67._4_4_;
          bVar19 = (bool)((byte)(uVar40 >> 2) & 1);
          auVar69._8_4_ = (uint)bVar19 * auVar68._8_4_ | (uint)!bVar19 * auVar67._8_4_;
          bVar19 = (bool)((byte)(uVar40 >> 3) & 1);
          auVar69._12_4_ = (uint)bVar19 * auVar68._12_4_ | (uint)!bVar19 * auVar67._12_4_;
          bVar19 = (bool)((byte)(uVar40 >> 4) & 1);
          auVar69._16_4_ = (uint)bVar19 * auVar68._16_4_ | (uint)!bVar19 * auVar67._16_4_;
          bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
          auVar69._20_4_ = (uint)bVar19 * auVar68._20_4_ | (uint)!bVar19 * auVar67._20_4_;
          bVar19 = (bool)((byte)(uVar40 >> 6) & 1);
          auVar69._24_4_ = (uint)bVar19 * auVar68._24_4_ | (uint)!bVar19 * auVar67._24_4_;
          bVar19 = SUB81(uVar40 >> 7,0);
          auVar69._28_4_ = (uint)bVar19 * auVar68._28_4_ | (uint)!bVar19 * auVar67._28_4_;
          auVar67 = vpermt2q_avx512vl(auVar65,auVar69,auVar66);
          uVar38 = auVar67._0_8_;
          bVar28 = bVar28 - 1 & bVar28;
          if (bVar28 != 0) {
            auVar67 = vpshufd_avx2(auVar69,0x55);
            vpermt2q_avx512vl(auVar65,auVar67,auVar66);
            auVar68 = vpminsd_avx2(auVar69,auVar67);
            auVar67 = vpmaxsd_avx2(auVar69,auVar67);
            bVar28 = bVar28 - 1 & bVar28;
            if (bVar28 == 0) {
              auVar70 = vpermi2q_avx512vl(auVar68,auVar65,auVar66);
              uVar38 = auVar70._0_8_;
              auVar65 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
              *local_25b0 = auVar65._0_8_;
              auVar64 = vpermd_avx2(auVar67,auVar64);
              *(int *)(local_25b0 + 1) = auVar64._0_4_;
              local_25b0 = local_25b0 + 2;
            }
            else {
              auVar83 = vpshufd_avx2(auVar69,0xaa);
              vpermt2q_avx512vl(auVar65,auVar83,auVar66);
              auVar73 = vpminsd_avx2(auVar68,auVar83);
              auVar68 = vpmaxsd_avx2(auVar68,auVar83);
              auVar83 = vpminsd_avx2(auVar67,auVar68);
              auVar67 = vpmaxsd_avx2(auVar67,auVar68);
              bVar28 = bVar28 - 1 & bVar28;
              if (bVar28 == 0) {
                auVar70 = vpermi2q_avx512vl(auVar73,auVar65,auVar66);
                uVar38 = auVar70._0_8_;
                auVar70 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                *local_25b0 = auVar70._0_8_;
                auVar70 = vpermd_avx2(auVar67,auVar64);
                *(int *)(local_25b0 + 1) = auVar70._0_4_;
                auVar65 = vpermt2q_avx512vl(auVar65,auVar83,auVar66);
                local_25b0[2] = auVar65._0_8_;
                auVar64 = vpermd_avx2(auVar83,auVar64);
                *(int *)(local_25b0 + 3) = auVar64._0_4_;
                local_25b0 = local_25b0 + 4;
              }
              else {
                auVar68 = vpshufd_avx2(auVar69,0xff);
                vpermt2q_avx512vl(auVar65,auVar68,auVar66);
                auVar72 = vpminsd_avx2(auVar73,auVar68);
                auVar68 = vpmaxsd_avx2(auVar73,auVar68);
                auVar73 = vpminsd_avx2(auVar83,auVar68);
                auVar68 = vpmaxsd_avx2(auVar83,auVar68);
                auVar83 = vpminsd_avx2(auVar67,auVar68);
                auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                bVar28 = bVar28 - 1 & bVar28;
                if (bVar28 == 0) {
                  auVar68 = vpermi2q_avx512vl(auVar72,auVar65,auVar66);
                  uVar38 = auVar68._0_8_;
                  auVar68 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                  *local_25b0 = auVar68._0_8_;
                  auVar67 = vpermd_avx2(auVar67,auVar64);
                  *(int *)(local_25b0 + 1) = auVar67._0_4_;
                  auVar67 = vpermt2q_avx512vl(auVar65,auVar83,auVar66);
                  local_25b0[2] = auVar67._0_8_;
                  auVar67 = vpermd_avx2(auVar83,auVar64);
                  *(int *)(local_25b0 + 3) = auVar67._0_4_;
                  auVar65 = vpermt2q_avx512vl(auVar65,auVar73,auVar66);
                  local_25b0[4] = auVar65._0_8_;
                  auVar64 = vpermd_avx2(auVar73,auVar64);
                  *(int *)(local_25b0 + 5) = auVar64._0_4_;
                  local_25b0 = local_25b0 + 6;
                }
                else {
                  auVar71 = valignd_avx512vl(auVar69,auVar69,3);
                  auVar68 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar72 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar68,auVar72);
                  auVar68 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar73 = vpermt2d_avx512vl(auVar72,auVar68,auVar73);
                  auVar73 = vpermt2d_avx512vl(auVar73,auVar68,auVar83);
                  auVar68 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar67 = vpermt2d_avx512vl(auVar73,auVar68,auVar67);
                  auVar90 = ZEXT3264(auVar67);
                  bVar33 = bVar28;
                  do {
                    auVar68 = auVar90._0_32_;
                    auVar86._8_4_ = 1;
                    auVar86._0_8_ = 0x100000001;
                    auVar86._12_4_ = 1;
                    auVar86._16_4_ = 1;
                    auVar86._20_4_ = 1;
                    auVar86._24_4_ = 1;
                    auVar86._28_4_ = 1;
                    auVar67 = vpermd_avx2(auVar86,auVar71);
                    auVar71 = valignd_avx512vl(auVar71,auVar71,1);
                    vpermt2q_avx512vl(auVar65,auVar71,auVar66);
                    bVar33 = bVar33 - 1 & bVar33;
                    uVar25 = vpcmpd_avx512vl(auVar67,auVar68,5);
                    auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                    bVar32 = (byte)uVar25 << 1;
                    auVar68 = valignd_avx512vl(auVar68,auVar68,7);
                    bVar19 = (bool)((byte)uVar25 & 1);
                    auVar74._4_4_ = (uint)bVar19 * auVar68._4_4_ | (uint)!bVar19 * auVar67._4_4_;
                    auVar74._0_4_ = auVar67._0_4_;
                    bVar19 = (bool)(bVar32 >> 2 & 1);
                    auVar74._8_4_ = (uint)bVar19 * auVar68._8_4_ | (uint)!bVar19 * auVar67._8_4_;
                    bVar19 = (bool)(bVar32 >> 3 & 1);
                    auVar74._12_4_ = (uint)bVar19 * auVar68._12_4_ | (uint)!bVar19 * auVar67._12_4_;
                    bVar19 = (bool)(bVar32 >> 4 & 1);
                    auVar74._16_4_ = (uint)bVar19 * auVar68._16_4_ | (uint)!bVar19 * auVar67._16_4_;
                    bVar19 = (bool)(bVar32 >> 5 & 1);
                    auVar74._20_4_ = (uint)bVar19 * auVar68._20_4_ | (uint)!bVar19 * auVar67._20_4_;
                    bVar19 = (bool)(bVar32 >> 6 & 1);
                    auVar74._24_4_ = (uint)bVar19 * auVar68._24_4_ | (uint)!bVar19 * auVar67._24_4_;
                    auVar74._28_4_ =
                         (uint)(bVar32 >> 7) * auVar68._28_4_ |
                         (uint)!(bool)(bVar32 >> 7) * auVar67._28_4_;
                    auVar90 = ZEXT3264(auVar74);
                  } while (bVar33 != 0);
                  lVar31 = (ulong)(uint)POPCOUNT((uint)bVar28) + 3;
                  do {
                    auVar67 = vpermi2q_avx512vl(auVar74,auVar65,auVar66);
                    *local_25b0 = auVar67._0_8_;
                    auVar68 = auVar90._0_32_;
                    auVar67 = vpermd_avx2(auVar68,auVar64);
                    *(int *)(local_25b0 + 1) = auVar67._0_4_;
                    auVar74 = valignd_avx512vl(auVar68,auVar68,1);
                    local_25b0 = local_25b0 + 2;
                    auVar90 = ZEXT3264(auVar74);
                    lVar31 = lVar31 + -1;
                  } while (lVar31 != 0);
                  auVar64 = vpermt2q_avx512vl(auVar65,auVar74,auVar66);
                  uVar38 = auVar64._0_8_;
                }
                auVar96 = ZEXT3264(local_2488);
                auVar97 = ZEXT3264(local_24a8);
                auVar98 = ZEXT3264(local_24c8);
                auVar99 = ZEXT3264(local_24e8);
                auVar100 = ZEXT3264(local_2508);
                auVar90 = ZEXT3264(auVar70);
                auVar92 = ZEXT3264(auVar92._0_32_);
                auVar93 = ZEXT3264(auVar93._0_32_);
                auVar94 = ZEXT3264(auVar94._0_32_);
                uVar36 = local_25f0;
              }
            }
          }
        }
        local_25a8 = (ulong)((uint)uVar38 & 0xf) - 8;
        if (local_25a8 != 0) {
          uVar38 = uVar38 & 0xfffffffffffffff0;
          pSVar35 = context->scene;
          local_25a0 = 0;
          local_25e8 = pSVar35;
          do {
            lVar31 = local_25a0 * 0x50;
            ppfVar14 = (pSVar35->vertices).items;
            pfVar15 = ppfVar14[*(uint *)(uVar38 + 0x30 + lVar31)];
            pfVar16 = ppfVar14[*(uint *)(uVar38 + 0x34 + lVar31)];
            pfVar17 = ppfVar14[*(uint *)(uVar38 + 0x38 + lVar31)];
            pfVar18 = ppfVar14[*(uint *)(uVar38 + 0x3c + lVar31)];
            auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar38 + lVar31)),
                                    *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar38 + 8 + lVar31))
                                   );
            auVar61 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar38 + lVar31)),
                                    *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar38 + 8 + lVar31))
                                   );
            auVar42 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar38 + 4 + lVar31))
                                    ,*(undefined1 (*) [16])
                                      (pfVar18 + *(uint *)(uVar38 + 0xc + lVar31)));
            auVar62 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar38 + 4 + lVar31))
                                    ,*(undefined1 (*) [16])
                                      (pfVar18 + *(uint *)(uVar38 + 0xc + lVar31)));
            auVar60 = vunpcklps_avx(auVar61,auVar62);
            auVar59 = vunpcklps_avx(auVar41,auVar42);
            auVar62 = vunpckhps_avx(auVar41,auVar42);
            auVar42 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar15 + *(uint *)(uVar38 + 0x10 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar17 + *(uint *)(uVar38 + 0x18 + lVar31)));
            auVar61 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar15 + *(uint *)(uVar38 + 0x10 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar17 + *(uint *)(uVar38 + 0x18 + lVar31)));
            auVar43 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar16 + *(uint *)(uVar38 + 0x14 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar18 + *(uint *)(uVar38 + 0x1c + lVar31)));
            auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar16 + *(uint *)(uVar38 + 0x14 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar18 + *(uint *)(uVar38 + 0x1c + lVar31)));
            auVar47 = vunpcklps_avx(auVar61,auVar41);
            auVar45 = vunpcklps_avx(auVar42,auVar43);
            auVar41 = vunpckhps_avx(auVar42,auVar43);
            auVar43 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar15 + *(uint *)(uVar38 + 0x20 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar17 + *(uint *)(uVar38 + 0x28 + lVar31)));
            auVar61 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar15 + *(uint *)(uVar38 + 0x20 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar17 + *(uint *)(uVar38 + 0x28 + lVar31)));
            auVar44 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar16 + *(uint *)(uVar38 + 0x24 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar18 + *(uint *)(uVar38 + 0x2c + lVar31)));
            auVar42 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar16 + *(uint *)(uVar38 + 0x24 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar18 + *(uint *)(uVar38 + 0x2c + lVar31)));
            auVar48 = vunpcklps_avx(auVar61,auVar42);
            auVar49 = vunpcklps_avx(auVar43,auVar44);
            auVar42 = vunpckhps_avx(auVar43,auVar44);
            puVar5 = (undefined8 *)(uVar38 + 0x30 + lVar31);
            local_23c8 = *puVar5;
            uStack_23c0 = puVar5[1];
            puVar5 = (undefined8 *)(uVar38 + 0x40 + lVar31);
            local_2518 = *puVar5;
            uStack_2510 = puVar5[1];
            uVar81 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar50._4_4_ = uVar81;
            auVar50._0_4_ = uVar81;
            auVar50._8_4_ = uVar81;
            auVar50._12_4_ = uVar81;
            uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar51._4_4_ = uVar81;
            auVar51._0_4_ = uVar81;
            auVar51._8_4_ = uVar81;
            auVar51._12_4_ = uVar81;
            auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar81 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar87._4_4_ = uVar81;
            auVar87._0_4_ = uVar81;
            auVar87._8_4_ = uVar81;
            auVar87._12_4_ = uVar81;
            uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar88._4_4_ = uVar81;
            auVar88._0_4_ = uVar81;
            auVar88._8_4_ = uVar81;
            auVar88._12_4_ = uVar81;
            local_25f5 = 0;
            fVar75 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar91._4_4_ = fVar75;
            auVar91._0_4_ = fVar75;
            auVar91._8_4_ = fVar75;
            auVar91._12_4_ = fVar75;
            auVar61 = vsubps_avx(auVar59,auVar50);
            auVar62 = vsubps_avx(auVar62,auVar51);
            auVar44 = vsubps_avx512vl(auVar60,auVar43);
            auVar45 = vsubps_avx512vl(auVar45,auVar50);
            auVar46 = vsubps_avx512vl(auVar41,auVar51);
            auVar47 = vsubps_avx512vl(auVar47,auVar43);
            auVar41 = vsubps_avx(auVar49,auVar50);
            auVar42 = vsubps_avx(auVar42,auVar51);
            auVar48 = vsubps_avx512vl(auVar48,auVar43);
            auVar60 = vsubps_avx(auVar41,auVar61);
            auVar59 = vsubps_avx(auVar42,auVar62);
            auVar49 = vsubps_avx512vl(auVar48,auVar44);
            auVar50 = vsubps_avx512vl(auVar61,auVar45);
            auVar51 = vsubps_avx512vl(auVar62,auVar46);
            auVar52 = vsubps_avx512vl(auVar44,auVar47);
            auVar53 = vsubps_avx512vl(auVar45,auVar41);
            auVar54 = vsubps_avx512vl(auVar46,auVar42);
            auVar55 = vsubps_avx512vl(auVar47,auVar48);
            auVar58._0_4_ = auVar41._0_4_ + auVar61._0_4_;
            auVar58._4_4_ = auVar41._4_4_ + auVar61._4_4_;
            auVar58._8_4_ = auVar41._8_4_ + auVar61._8_4_;
            auVar58._12_4_ = auVar41._12_4_ + auVar61._12_4_;
            auVar89._0_4_ = auVar42._0_4_ + auVar62._0_4_;
            auVar89._4_4_ = auVar42._4_4_ + auVar62._4_4_;
            auVar89._8_4_ = auVar42._8_4_ + auVar62._8_4_;
            auVar89._12_4_ = auVar42._12_4_ + auVar62._12_4_;
            auVar43 = vaddps_avx512vl(auVar48,auVar44);
            auVar56 = vmulps_avx512vl(auVar89,auVar49);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar59,auVar43);
            auVar43 = vmulps_avx512vl(auVar43,auVar60);
            auVar57 = vfmsub231ps_avx512vl(auVar43,auVar49,auVar58);
            auVar84._0_4_ = auVar59._0_4_ * auVar58._0_4_;
            auVar84._4_4_ = auVar59._4_4_ * auVar58._4_4_;
            auVar84._8_4_ = auVar59._8_4_ * auVar58._8_4_;
            auVar84._12_4_ = auVar59._12_4_ * auVar58._12_4_;
            auVar43 = vfmsub231ps_fma(auVar84,auVar60,auVar89);
            auVar85._0_4_ = fVar75 * auVar43._0_4_;
            auVar85._4_4_ = fVar75 * auVar43._4_4_;
            auVar85._8_4_ = fVar75 * auVar43._8_4_;
            auVar85._12_4_ = fVar75 * auVar43._12_4_;
            auVar43 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar57);
            local_2468 = vfmadd231ps_avx512vl(auVar43,auVar87,auVar56);
            auVar43 = vaddps_avx512vl(auVar61,auVar45);
            auVar56 = vaddps_avx512vl(auVar62,auVar46);
            auVar57 = vaddps_avx512vl(auVar44,auVar47);
            auVar58 = vmulps_avx512vl(auVar56,auVar52);
            auVar58 = vfmsub231ps_avx512vl(auVar58,auVar51,auVar57);
            auVar57 = vmulps_avx512vl(auVar57,auVar50);
            auVar57 = vfmsub231ps_avx512vl(auVar57,auVar52,auVar43);
            auVar43 = vmulps_avx512vl(auVar43,auVar51);
            auVar43 = vfmsub231ps_avx512vl(auVar43,auVar50,auVar56);
            auVar56._0_4_ = fVar75 * auVar43._0_4_;
            auVar56._4_4_ = fVar75 * auVar43._4_4_;
            auVar56._8_4_ = fVar75 * auVar43._8_4_;
            auVar56._12_4_ = fVar75 * auVar43._12_4_;
            auVar43 = vfmadd231ps_avx512vl(auVar56,auVar88,auVar57);
            local_2458 = vfmadd231ps_avx512vl(auVar43,auVar87,auVar58);
            auVar41 = vaddps_avx512vl(auVar45,auVar41);
            auVar42 = vaddps_avx512vl(auVar46,auVar42);
            auVar43 = vaddps_avx512vl(auVar47,auVar48);
            auVar47 = vmulps_avx512vl(auVar42,auVar55);
            auVar47 = vfmsub231ps_avx512vl(auVar47,auVar54,auVar43);
            auVar43 = vmulps_avx512vl(auVar43,auVar53);
            auVar43 = vfmsub231ps_avx512vl(auVar43,auVar55,auVar41);
            auVar45._0_4_ = auVar41._0_4_ * auVar54._0_4_;
            auVar45._4_4_ = auVar41._4_4_ * auVar54._4_4_;
            auVar45._8_4_ = auVar41._8_4_ * auVar54._8_4_;
            auVar45._12_4_ = auVar41._12_4_ * auVar54._12_4_;
            auVar41 = vfmsub231ps_fma(auVar45,auVar53,auVar42);
            auVar41 = vmulps_avx512vl(auVar91,auVar41);
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar88,auVar43);
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar87,auVar47);
            auVar48._0_4_ = local_2458._0_4_ + local_2468._0_4_;
            auVar48._4_4_ = local_2458._4_4_ + local_2468._4_4_;
            auVar48._8_4_ = local_2458._8_4_ + local_2468._8_4_;
            auVar48._12_4_ = local_2458._12_4_ + local_2468._12_4_;
            local_2448 = vaddps_avx512vl(auVar41,auVar48);
            auVar43._8_4_ = 0x7fffffff;
            auVar43._0_8_ = 0x7fffffff7fffffff;
            auVar43._12_4_ = 0x7fffffff;
            auVar42 = vandps_avx512vl(local_2448,auVar43);
            auVar47._8_4_ = 0x34000000;
            auVar47._0_8_ = 0x3400000034000000;
            auVar47._12_4_ = 0x34000000;
            auVar43 = vmulps_avx512vl(auVar42,auVar47);
            auVar47 = vminps_avx512vl(local_2468,local_2458);
            auVar47 = vminps_avx512vl(auVar47,auVar41);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar45 = vxorps_avx512vl(auVar43,auVar45);
            uVar25 = vcmpps_avx512vl(auVar47,auVar45,5);
            auVar47 = vmaxps_avx512vl(local_2468,local_2458);
            auVar41 = vmaxps_avx512vl(auVar47,auVar41);
            uVar21 = vcmpps_avx512vl(auVar41,auVar43,2);
            bVar28 = ((byte)uVar25 | (byte)uVar21) & 0xf;
            pSVar35 = local_25e8;
            if (bVar28 != 0) {
              auVar41 = vmulps_avx512vl(auVar49,auVar51);
              auVar43 = vmulps_avx512vl(auVar60,auVar52);
              auVar47 = vmulps_avx512vl(auVar59,auVar50);
              auVar45 = vmulps_avx512vl(auVar52,auVar54);
              auVar48 = vmulps_avx512vl(auVar50,auVar55);
              auVar46 = vmulps_avx512vl(auVar51,auVar53);
              auVar59 = vfmsub213ps_avx512vl(auVar59,auVar52,auVar41);
              auVar49 = vfmsub213ps_avx512vl(auVar49,auVar50,auVar43);
              auVar60 = vfmsub213ps_avx512vl(auVar60,auVar51,auVar47);
              auVar51 = vfmsub213ps_avx512vl(auVar55,auVar51,auVar45);
              auVar52 = vfmsub213ps_avx512vl(auVar53,auVar52,auVar48);
              auVar50 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar46);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar41 = vandps_avx512vl(auVar41,auVar53);
              auVar45 = vandps_avx512vl(auVar45,auVar53);
              uVar40 = vcmpps_avx512vl(auVar41,auVar45,1);
              auVar41 = vandps_avx512vl(auVar43,auVar53);
              auVar43 = vandps_avx512vl(auVar48,auVar53);
              uVar22 = vcmpps_avx512vl(auVar41,auVar43,1);
              auVar41 = vandps_avx512vl(auVar47,auVar53);
              auVar43 = vandps_avx512vl(auVar46,auVar53);
              uVar23 = vcmpps_avx512vl(auVar41,auVar43,1);
              bVar19 = (bool)((byte)uVar40 & 1);
              local_23f8._0_4_ = (uint)bVar19 * auVar59._0_4_ | (uint)!bVar19 * auVar51._0_4_;
              bVar19 = (bool)((byte)(uVar40 >> 1) & 1);
              local_23f8._4_4_ = (uint)bVar19 * auVar59._4_4_ | (uint)!bVar19 * auVar51._4_4_;
              bVar19 = (bool)((byte)(uVar40 >> 2) & 1);
              local_23f8._8_4_ = (uint)bVar19 * auVar59._8_4_ | (uint)!bVar19 * auVar51._8_4_;
              bVar19 = (bool)((byte)(uVar40 >> 3) & 1);
              local_23f8._12_4_ = (uint)bVar19 * auVar59._12_4_ | (uint)!bVar19 * auVar51._12_4_;
              bVar19 = (bool)((byte)uVar22 & 1);
              local_23e8._0_4_ = (uint)bVar19 * auVar49._0_4_ | (uint)!bVar19 * auVar52._0_4_;
              bVar19 = (bool)((byte)(uVar22 >> 1) & 1);
              local_23e8._4_4_ = (uint)bVar19 * auVar49._4_4_ | (uint)!bVar19 * auVar52._4_4_;
              bVar19 = (bool)((byte)(uVar22 >> 2) & 1);
              local_23e8._8_4_ = (uint)bVar19 * auVar49._8_4_ | (uint)!bVar19 * auVar52._8_4_;
              bVar19 = (bool)((byte)(uVar22 >> 3) & 1);
              local_23e8._12_4_ = (uint)bVar19 * auVar49._12_4_ | (uint)!bVar19 * auVar52._12_4_;
              bVar19 = (bool)((byte)uVar23 & 1);
              local_23d8[0] = (float)((uint)bVar19 * auVar60._0_4_ | (uint)!bVar19 * auVar50._0_4_);
              bVar19 = (bool)((byte)(uVar23 >> 1) & 1);
              local_23d8[1] = (float)((uint)bVar19 * auVar60._4_4_ | (uint)!bVar19 * auVar50._4_4_);
              bVar19 = (bool)((byte)(uVar23 >> 2) & 1);
              local_23d8[2] = (float)((uint)bVar19 * auVar60._8_4_ | (uint)!bVar19 * auVar50._8_4_);
              bVar19 = (bool)((byte)(uVar23 >> 3) & 1);
              local_23d8[3] =
                   (float)((uint)bVar19 * auVar60._12_4_ | (uint)!bVar19 * auVar50._12_4_);
              auVar52._0_4_ = fVar75 * local_23d8[0];
              auVar52._4_4_ = fVar75 * local_23d8[1];
              auVar52._8_4_ = fVar75 * local_23d8[2];
              auVar52._12_4_ = fVar75 * local_23d8[3];
              auVar41 = vfmadd213ps_fma(auVar88,local_23e8,auVar52);
              auVar41 = vfmadd213ps_fma(auVar87,local_23f8,auVar41);
              auVar49._0_4_ = auVar41._0_4_ + auVar41._0_4_;
              auVar49._4_4_ = auVar41._4_4_ + auVar41._4_4_;
              auVar49._8_4_ = auVar41._8_4_ + auVar41._8_4_;
              auVar49._12_4_ = auVar41._12_4_ + auVar41._12_4_;
              auVar46._0_4_ = auVar44._0_4_ * local_23d8[0];
              auVar46._4_4_ = auVar44._4_4_ * local_23d8[1];
              auVar46._8_4_ = auVar44._8_4_ * local_23d8[2];
              auVar46._12_4_ = auVar44._12_4_ * local_23d8[3];
              auVar62 = vfmadd213ps_fma(auVar62,local_23e8,auVar46);
              auVar62 = vfmadd213ps_fma(auVar61,local_23f8,auVar62);
              auVar41 = vrcp14ps_avx512vl(auVar49);
              auVar61._8_4_ = 0x3f800000;
              auVar61._0_8_ = 0x3f8000003f800000;
              auVar61._12_4_ = 0x3f800000;
              auVar61 = vfnmadd213ps_avx512vl(auVar41,auVar49,auVar61);
              auVar61 = vfmadd132ps_fma(auVar61,auVar41,auVar41);
              local_2408._0_4_ = (auVar62._0_4_ + auVar62._0_4_) * auVar61._0_4_;
              local_2408._4_4_ = (auVar62._4_4_ + auVar62._4_4_) * auVar61._4_4_;
              local_2408._8_4_ = (auVar62._8_4_ + auVar62._8_4_) * auVar61._8_4_;
              local_2408._12_4_ = (auVar62._12_4_ + auVar62._12_4_) * auVar61._12_4_;
              auVar78 = ZEXT1664(local_2408);
              uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar62._4_4_ = uVar81;
              auVar62._0_4_ = uVar81;
              auVar62._8_4_ = uVar81;
              auVar62._12_4_ = uVar81;
              uVar25 = vcmpps_avx512vl(local_2408,auVar62,0xd);
              uVar40 = CONCAT44(auVar49._4_4_,auVar49._0_4_);
              auVar44._0_8_ = uVar40 ^ 0x8000000080000000;
              auVar44._8_4_ = -auVar49._8_4_;
              auVar44._12_4_ = -auVar49._12_4_;
              fVar75 = (ray->super_RayK<1>).tfar;
              auVar59._4_4_ = fVar75;
              auVar59._0_4_ = fVar75;
              auVar59._8_4_ = fVar75;
              auVar59._12_4_ = fVar75;
              uVar21 = vcmpps_avx512vl(local_2408,auVar59,2);
              uVar24 = vcmpps_avx512vl(auVar49,auVar44,4);
              bVar28 = (byte)uVar25 & (byte)uVar21 & (byte)uVar24 & bVar28;
              if (bVar28 != 0) {
                auVar53._0_4_ = (ray->super_RayK<1>).tfar;
                auVar53._4_4_ = (ray->super_RayK<1>).mask;
                auVar53._8_4_ = (ray->super_RayK<1>).id;
                auVar53._12_4_ = (ray->super_RayK<1>).flags;
                auVar90 = ZEXT1664(auVar53);
                uVar29 = vextractps_avx(auVar53,1);
                local_2438 = &local_25f5;
                local_2430 = bVar28;
                uVar40 = vcmpps_avx512vl(auVar42,auVar95._0_16_,5);
                auVar62 = vrcp14ps_avx512vl(local_2448);
                auVar80._8_4_ = 0x3f800000;
                auVar80._0_8_ = 0x3f8000003f800000;
                auVar80._12_4_ = 0x3f800000;
                auVar61 = vfnmadd213ps_fma(local_2448,auVar62,auVar80);
                auVar61 = vfmadd132ps_avx512vl(auVar61,auVar62,auVar62);
                fVar75 = (float)((uint)((byte)uVar40 & 1) * auVar61._0_4_);
                fVar1 = (float)((uint)((byte)(uVar40 >> 1) & 1) * auVar61._4_4_);
                fVar2 = (float)((uint)((byte)(uVar40 >> 2) & 1) * auVar61._8_4_);
                fVar3 = (float)((uint)((byte)(uVar40 >> 3) & 1) * auVar61._12_4_);
                auVar55._0_4_ = fVar75 * local_2468._0_4_;
                auVar55._4_4_ = fVar1 * local_2468._4_4_;
                auVar55._8_4_ = fVar2 * local_2468._8_4_;
                auVar55._12_4_ = fVar3 * local_2468._12_4_;
                local_2428 = vminps_avx(auVar55,auVar80);
                auVar57._0_4_ = fVar75 * local_2458._0_4_;
                auVar57._4_4_ = fVar1 * local_2458._4_4_;
                auVar57._8_4_ = fVar2 * local_2458._8_4_;
                auVar57._12_4_ = fVar3 * local_2458._12_4_;
                local_2418 = vminps_avx(auVar57,auVar80);
                auVar76._8_4_ = 0x7f800000;
                auVar76._0_8_ = 0x7f8000007f800000;
                auVar76._12_4_ = 0x7f800000;
                auVar61 = vblendmps_avx512vl(auVar76,local_2408);
                auVar54._0_4_ =
                     (uint)(bVar28 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar28 & 1) * 0x7f800000;
                bVar19 = (bool)(bVar28 >> 1 & 1);
                auVar54._4_4_ = (uint)bVar19 * auVar61._4_4_ | (uint)!bVar19 * 0x7f800000;
                bVar19 = (bool)(bVar28 >> 2 & 1);
                auVar54._8_4_ = (uint)bVar19 * auVar61._8_4_ | (uint)!bVar19 * 0x7f800000;
                auVar54._12_4_ =
                     (uint)(bVar28 >> 3) * auVar61._12_4_ | (uint)!(bool)(bVar28 >> 3) * 0x7f800000;
                auVar61 = vshufps_avx(auVar54,auVar54,0xb1);
                auVar61 = vminps_avx(auVar61,auVar54);
                auVar62 = vshufpd_avx(auVar61,auVar61,1);
                auVar61 = vminps_avx(auVar62,auVar61);
                uVar25 = vcmpps_avx512vl(auVar54,auVar61,0);
                bVar33 = (byte)uVar25 & bVar28;
                do {
                  local_25f4 = (uint)bVar28;
                  bVar32 = bVar28;
                  if (bVar33 != 0) {
                    bVar32 = bVar33;
                  }
                  uVar26 = 0;
                  for (uVar34 = (uint)bVar32; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000)
                  {
                    uVar26 = uVar26 + 1;
                  }
                  local_25e0 = (ulong)uVar26;
                  local_2550 = *(uint *)((long)&local_23c8 + local_25e0 * 4);
                  local_25b8 = (pSVar35->geometries).items[local_2550].ptr;
                  if ((local_25b8->mask & uVar29) == 0) {
                    bVar28 = ~(byte)(1 << (uVar26 & 0x1f)) & bVar28;
                  }
                  else {
                    local_25c0 = context->args;
                    local_2538 = auVar90._0_16_;
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      local_2598.context = context->user;
                      if (local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar40 = (ulong)(uVar26 << 2);
                        fVar75 = *(float *)(local_2428 + uVar40);
                        fVar1 = *(float *)(local_2418 + uVar40);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2408 + uVar40);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_23f8 + uVar40);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_23e8 + uVar40);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_23d8 + uVar40);
                        ray->u = fVar75;
                        ray->v = fVar1;
                        ray->primID = *(uint *)((long)&local_2518 + uVar40);
                        ray->geomID = local_2550;
                        ray->instID[0] = (local_2598.context)->instID[0];
                        ray->instPrimID[0] = (local_2598.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_2598.context = context->user;
                    }
                    uVar40 = (ulong)(uVar26 * 4);
                    local_2568 = *(float *)(local_23f8 + uVar40);
                    local_2564 = *(undefined4 *)(local_23e8 + uVar40);
                    local_2560 = *(undefined4 *)((long)local_23d8 + uVar40);
                    local_255c = *(undefined4 *)(local_2428 + uVar40);
                    local_2558 = *(undefined4 *)(local_2418 + uVar40);
                    local_2554 = *(undefined4 *)((long)&local_2518 + uVar40);
                    local_254c = (local_2598.context)->instID[0];
                    local_2548 = (local_2598.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2408 + uVar40);
                    local_25d4 = -1;
                    local_2598.valid = &local_25d4;
                    local_2598.geometryUserPtr = local_25b8->userPtr;
                    local_2598.ray = (RTCRayN *)ray;
                    local_2598.hit = (RTCHitN *)&local_2568;
                    local_2598.N = 1;
                    local_2528 = auVar78._0_16_;
                    if (local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f2cc57:
                      if ((local_25c0->filter != (RTCFilterFunctionN)0x0) &&
                         (((local_25c0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_25b8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*local_25c0->filter)(&local_2598);
                        auVar78 = ZEXT1664(local_2528);
                        auVar100 = ZEXT3264(local_2508);
                        auVar99 = ZEXT3264(local_24e8);
                        auVar98 = ZEXT3264(local_24c8);
                        auVar97 = ZEXT3264(local_24a8);
                        auVar96 = ZEXT3264(local_2488);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                        auVar95 = ZEXT1664(auVar61);
                        ray = local_25d0;
                        context = local_25c8;
                        pSVar35 = local_25e8;
                        uVar36 = local_25f0;
                        if (*local_2598.valid == 0) goto LAB_01f2cd48;
                      }
                      (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2598.hit;
                      (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2598.hit + 4);
                      (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2598.hit + 8);
                      *(float *)((long)local_2598.ray + 0x3c) = *(float *)(local_2598.hit + 0xc);
                      *(float *)((long)local_2598.ray + 0x40) = *(float *)(local_2598.hit + 0x10);
                      *(float *)((long)local_2598.ray + 0x44) = *(float *)(local_2598.hit + 0x14);
                      *(float *)((long)local_2598.ray + 0x48) = *(float *)(local_2598.hit + 0x18);
                      *(float *)((long)local_2598.ray + 0x4c) = *(float *)(local_2598.hit + 0x1c);
                      *(float *)((long)local_2598.ray + 0x50) = *(float *)(local_2598.hit + 0x20);
                    }
                    else {
                      (*local_25b8->intersectionFilterN)(&local_2598);
                      auVar78 = ZEXT1664(local_2528);
                      auVar100 = ZEXT3264(local_2508);
                      auVar99 = ZEXT3264(local_24e8);
                      auVar98 = ZEXT3264(local_24c8);
                      auVar97 = ZEXT3264(local_24a8);
                      auVar96 = ZEXT3264(local_2488);
                      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                      auVar95 = ZEXT1664(auVar61);
                      ray = local_25d0;
                      context = local_25c8;
                      pSVar35 = local_25e8;
                      uVar36 = local_25f0;
                      if (*local_2598.valid != 0) goto LAB_01f2cc57;
LAB_01f2cd48:
                      (local_25d0->super_RayK<1>).tfar = (float)local_2538._0_4_;
                      ray = local_25d0;
                      context = local_25c8;
                      pSVar35 = local_25e8;
                      uVar36 = local_25f0;
                    }
                    auVar7._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar7._4_4_ = (ray->super_RayK<1>).mask;
                    auVar7._8_4_ = (ray->super_RayK<1>).id;
                    auVar7._12_4_ = (ray->super_RayK<1>).flags;
                    auVar90 = ZEXT1664(auVar7);
                    fVar75 = (ray->super_RayK<1>).tfar;
                    auVar27._4_4_ = fVar75;
                    auVar27._0_4_ = fVar75;
                    auVar27._8_4_ = fVar75;
                    auVar27._12_4_ = fVar75;
                    uVar25 = vcmpps_avx512vl(auVar78._0_16_,auVar27,2);
                    bVar28 = ~(byte)(1 << ((uint)local_25e0 & 0x1f)) & (byte)local_25f4 &
                             (byte)uVar25;
                    uVar29 = vextractps_avx(auVar7,1);
                  }
                  if (bVar28 == 0) break;
                  auVar77._8_4_ = 0x7f800000;
                  auVar77._0_8_ = 0x7f8000007f800000;
                  auVar77._12_4_ = 0x7f800000;
                  auVar61 = vblendmps_avx512vl(auVar77,auVar78._0_16_);
                  auVar63._0_4_ =
                       (uint)(bVar28 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar28 & 1) * 0x7f800000;
                  bVar19 = (bool)(bVar28 >> 1 & 1);
                  auVar63._4_4_ = (uint)bVar19 * auVar61._4_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)(bVar28 >> 2 & 1);
                  auVar63._8_4_ = (uint)bVar19 * auVar61._8_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)(bVar28 >> 3 & 1);
                  auVar63._12_4_ = (uint)bVar19 * auVar61._12_4_ | (uint)!bVar19 * 0x7f800000;
                  auVar61 = vshufps_avx(auVar63,auVar63,0xb1);
                  auVar61 = vminps_avx(auVar61,auVar63);
                  auVar62 = vshufpd_avx(auVar61,auVar61,1);
                  auVar61 = vminps_avx(auVar62,auVar61);
                  uVar25 = vcmpps_avx512vl(auVar63,auVar61,0);
                  bVar33 = (byte)uVar25 & bVar28;
                } while( true );
              }
            }
            local_25a0 = local_25a0 + 1;
          } while (local_25a0 != local_25a8);
        }
        fVar75 = (ray->super_RayK<1>).tfar;
        auVar78 = ZEXT3264(CONCAT428(fVar75,CONCAT424(fVar75,CONCAT420(fVar75,CONCAT416(fVar75,
                                                  CONCAT412(fVar75,CONCAT48(fVar75,CONCAT44(fVar75,
                                                  fVar75))))))));
        auVar90 = ZEXT3264(local_2398);
        auVar92 = ZEXT3264(local_23b8);
        auVar93 = ZEXT3264(_DAT_01fe9900);
        auVar94 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
      }
LAB_01f2ce4e:
    } while (local_25b0 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }